

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

BOOL MAPGetRegionInfo(LPVOID lpAddress,PMEMORY_BASIC_INFORMATION lpBuffer)

{
  int iVar1;
  _LIST_ENTRY **pp_Var2;
  DWORD DVar3;
  CPalThread *pThread;
  LIST_ENTRY *pLVar4;
  LPVOID pvVar5;
  BOOL BVar6;
  
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
  pLVar4 = MappedViewList.Flink;
  BVar6 = 0;
  if (MappedViewList.Flink != &MappedViewList) {
    do {
      if ((pLVar4[1].Blink <= lpAddress) &&
         (pvVar5 = (LPVOID)((long)&(pLVar4[1].Blink)->Flink +
                           (ulong)(*(int *)&pLVar4[2].Flink + 0xfffU & 0xfffff000)),
         lpAddress < pvVar5)) {
        BVar6 = 1;
        if (lpBuffer != (PMEMORY_BASIC_INFORMATION)0x0) {
          lpBuffer->BaseAddress = lpAddress;
          lpBuffer->AllocationProtect = 0;
          lpBuffer->RegionSize = (long)pvVar5 - ((ulong)lpAddress & 0xfffffffffffff000);
          lpBuffer->State = 0x1000;
          iVar1 = *(int *)&pLVar4[2].Blink;
          DVar3 = 4;
          if ((iVar1 != 6) && (DVar3 = 8, 1 < iVar1 - 1U)) {
            if (iVar1 == 4) {
              DVar3 = 2;
            }
            else if (iVar1 == 0) {
              DVar3 = 1;
            }
            else {
              fprintf(_stderr,"] %s %s:%d","MAPConvertAccessToProtect",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                      ,0x6a6);
              fprintf(_stderr,"Unknown flag for flAccess.\n");
              DVar3 = 0xffffffff;
            }
          }
          lpBuffer->Protect = DVar3;
          lpBuffer->Type = 0x40000;
        }
        break;
      }
      pp_Var2 = &pLVar4->Flink;
      pLVar4 = *pp_Var2;
      BVar6 = 0;
    } while (*pp_Var2 != &MappedViewList);
  }
  CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
  return BVar6;
}

Assistant:

BOOL MAPGetRegionInfo(LPVOID lpAddress,
                      PMEMORY_BASIC_INFORMATION lpBuffer)
{
    BOOL fFound = FALSE;
    CPalThread * pThread = InternalGetCurrentThread();
    
    InternalEnterCriticalSection(pThread, &mapping_critsec);

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        UINT MappedSize;
        VOID * real_map_addr;
        SIZE_T real_map_sz;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        real_map_addr = pView->pNMHolder->address;
        real_map_sz = pView->pNMHolder->size;
#else
        real_map_addr = pView->lpAddress;
        real_map_sz = pView->NumberOfBytesToMap;
#endif

        MappedSize = ((real_map_sz-1) & ~VIRTUAL_PAGE_MASK) + VIRTUAL_PAGE_SIZE; 
        if ( real_map_addr <= lpAddress && 
             (VOID *)((UINT_PTR)real_map_addr+MappedSize) > lpAddress )
        {
            if (lpBuffer)
            {
                SIZE_T regionSize = MappedSize + (UINT_PTR) real_map_addr - 
                       ((UINT_PTR) lpAddress & ~VIRTUAL_PAGE_MASK);

                lpBuffer->BaseAddress = lpAddress;
                lpBuffer->AllocationProtect = 0;
                lpBuffer->RegionSize = regionSize;
                lpBuffer->State = MEM_COMMIT;
                lpBuffer->Protect = MAPConvertAccessToProtect(pView->dwDesiredAccess);
                lpBuffer->Type = MEM_MAPPED;
            }

            fFound = TRUE;
            break;
        }
    }

    InternalLeaveCriticalSection(pThread, &mapping_critsec);
    
    return fFound;
}